

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrator.cpp
# Opt level: O0

void __thiscall
pbrt::WavefrontPathIntegrator::UpdateFramebufferFromFilm
          (WavefrontPathIntegrator *this,Bounds2i pixelBounds,Float exposure,RGB *rgb)

{
  char *in_RDX;
  undefined8 in_RSI;
  int nItems;
  anon_class_32_4_0a0efb5b *in_RDI;
  WavefrontPathIntegrator *unaff_retaddr;
  Vector2i resolution;
  
  nItems = (int)((ulong)in_RSI >> 0x20);
  Bounds2<int>::Diagonal((Bounds2<int> *)in_RDI);
  ParallelFor<pbrt::WavefrontPathIntegrator::UpdateFramebufferFromFilm(pbrt::Bounds2<int>,float,pbrt::RGB*)::__0>
            (unaff_retaddr,in_RDX,nItems,in_RDI);
  return;
}

Assistant:

void WavefrontPathIntegrator::UpdateFramebufferFromFilm(Bounds2i pixelBounds,
                                                        Float exposure, RGB *rgb) {
    Vector2i resolution = pixelBounds.Diagonal();
    ParallelFor(
        "Update framebuffer", resolution.x * resolution.y,
        PBRT_CPU_GPU_LAMBDA(int index) {
            Point2i p(index % resolution.x, index / resolution.x);
            rgb[index] = exposure * film.GetPixelRGB(p + film.PixelBounds().pMin);
        });
}